

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::nrmore(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint x;
  uint x_00;
  ulong n;
  
  requireRStackDepth(this,1,"NR>");
  this_00 = &this->rStack;
  x = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  n = (ulong)x;
  requireRStackDepth(this,n,"NR>");
  requireDStackAvailable(this,(ulong)(x + 1),"R>");
  if (x != 0) {
    do {
      x_00 = ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::push(&this->dStack,x_00);
      ForthStack<unsigned_int>::pop(this_00);
      n = n - 1;
    } while (n != 0);
  }
  ForthStack<unsigned_int>::push(&this->dStack,x);
  return;
}

Assistant:

void nrmore() {
			REQUIRE_RSTACK_DEPTH(1, "NR>");
			auto index = rStack.getTop(); rpop();
			REQUIRE_RSTACK_DEPTH(index, "NR>");
			REQUIRE_DSTACK_AVAILABLE(index+1, "R>");
			for(size_t i=0;i<index;++i){
			 push(rStack.getTop()); rpop();
			}
			push(index);
		}